

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::detail::SocketStream::is_writable(SocketStream *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int __fd;
  fd_set fds;
  timeval local_b8;
  fd_set local_a8;
  
  __fd = this->sock_;
  if (__fd < 0x400) {
    local_a8.fds_bits[0xe] = 0;
    local_a8.fds_bits[0xf] = 0;
    local_a8.fds_bits[0xc] = 0;
    local_a8.fds_bits[0xd] = 0;
    local_a8.fds_bits[10] = 0;
    local_a8.fds_bits[0xb] = 0;
    local_a8.fds_bits[8] = 0;
    local_a8.fds_bits[9] = 0;
    local_a8.fds_bits[6] = 0;
    local_a8.fds_bits[7] = 0;
    local_a8.fds_bits[4] = 0;
    local_a8.fds_bits[5] = 0;
    local_a8.fds_bits[2] = 0;
    local_a8.fds_bits[3] = 0;
    local_a8.fds_bits[0] = 0;
    local_a8.fds_bits[1] = 0;
    iVar1 = __fd + 0x3f;
    if (-1 < __fd) {
      iVar1 = __fd;
    }
    local_a8.fds_bits[iVar1 >> 6] =
         local_a8.fds_bits[iVar1 >> 6] | 1L << ((byte)(__fd % 0x40) & 0x3f);
    local_b8.tv_sec = this->write_timeout_sec_;
    local_b8.tv_usec = this->write_timeout_usec_;
    while( true ) {
      iVar1 = select(__fd + 1,(fd_set *)0x0,&local_a8,(fd_set *)0x0,&local_b8);
      if (-1 < iVar1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        return false;
      }
    }
    if (iVar1 == 0) {
      return false;
    }
    __fd = this->sock_;
    if (__fd < 0x400) {
      local_a8.fds_bits[0xe] = 0;
      local_a8.fds_bits[0xf] = 0;
      local_a8.fds_bits[0xc] = 0;
      local_a8.fds_bits[0xd] = 0;
      local_a8.fds_bits[10] = 0;
      local_a8.fds_bits[0xb] = 0;
      local_a8.fds_bits[8] = 0;
      local_a8.fds_bits[9] = 0;
      local_a8.fds_bits[6] = 0;
      local_a8.fds_bits[7] = 0;
      local_a8.fds_bits[4] = 0;
      local_a8.fds_bits[5] = 0;
      local_a8.fds_bits[2] = 0;
      local_a8.fds_bits[3] = 0;
      local_a8.fds_bits[0] = 0;
      local_a8.fds_bits[1] = 0;
      iVar1 = __fd + 0x3f;
      if (-1 < __fd) {
        iVar1 = __fd;
      }
      local_a8.fds_bits[iVar1 >> 6] =
           local_a8.fds_bits[iVar1 >> 6] | 1L << ((byte)(__fd % 0x40) & 0x3f);
      local_b8.tv_sec = 0;
      local_b8.tv_usec = 0;
      do {
        iVar1 = select(__fd + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
        if (-1 < iVar1) {
          if (iVar1 == 0) {
            return true;
          }
          goto LAB_00126724;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      if (*piVar3 == 9) {
        return false;
      }
    }
  }
LAB_00126724:
  do {
    sVar2 = recv(__fd,&local_a8,1,2);
    if (-1 < sVar2) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return 0 < sVar2;
}

Assistant:

inline bool SocketStream::is_writable() const {
  return select_write(sock_, write_timeout_sec_, write_timeout_usec_) > 0 &&
         is_socket_alive(sock_);
}